

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode cf_h2_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  CURLcode local_58;
  int local_54;
  ulong local_50;
  size_t effective_max;
  cf_call_data save;
  cf_h2_ctx *ctx;
  void *pres2_local;
  int *pres1_local;
  int query_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  puVar1 = (undefined8 *)cf->ctx;
  if (query == 1) {
    uVar2 = *(undefined8 *)((long)cf->ctx + 0x10);
    *(Curl_easy **)((long)cf->ctx + 0x10) = data;
    iVar3 = nghttp2_session_check_request_allowed((nghttp2_session *)*puVar1);
    if (iVar3 == 0) {
      local_50 = (cf->conn->easyq).size;
    }
    else {
      local_50 = (ulong)*(uint *)(puVar1 + 1);
    }
    if (local_50 < 0x80000000) {
      local_54 = (int)local_50;
    }
    else {
      local_54 = 0x7fffffff;
    }
    *pres1 = local_54;
    *(undefined8 *)((long)cf->ctx + 0x10) = uVar2;
    cf_local._4_4_ = CURLE_OK;
  }
  else {
    if (cf->next == (Curl_cfilter *)0x0) {
      local_58 = CURLE_UNKNOWN_OPTION;
    }
    else {
      local_58 = (*cf->next->cft->query)(cf->next,data,query,pres1,pres2);
    }
    cf_local._4_4_ = local_58;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode cf_h2_query(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int query, int *pres1, void *pres2)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct cf_call_data save;
  size_t effective_max;

  switch(query) {
  case CF_QUERY_MAX_CONCURRENT:
    DEBUGASSERT(pres1);

    CF_DATA_SAVE(save, cf, data);
    if(nghttp2_session_check_request_allowed(ctx->h2) == 0) {
      /* the limit is what we have in use right now */
      effective_max = CONN_INUSE(cf->conn);
    }
    else {
      effective_max = ctx->max_concurrent_streams;
    }
    *pres1 = (effective_max > INT_MAX)? INT_MAX : (int)effective_max;
    CF_DATA_RESTORE(cf, save);
    return CURLE_OK;
  default:
    break;
  }
  return cf->next?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}